

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

void __thiscall
re2::Prog::EmitList(Prog *this,int root,SparseArray<int> *rootmap,
                   vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat,
                   SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  pointer *ppIVar1;
  iterator iVar2;
  Inst *pIVar3;
  iterator iVar4;
  pointer pIVar5;
  bool bVar6;
  pointer piVar7;
  int *piVar8;
  uint i;
  uint uVar9;
  int iVar10;
  uint local_54;
  vector<int,_std::allocator<int>_> *local_50;
  SparseArray<int> *local_48;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_3c;
  Prog *local_38;
  
  reachable->size_ = 0;
  piVar7 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar7) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar7;
  }
  iVar2._M_current =
       (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  local_54 = root;
  local_50 = stk;
  local_48 = rootmap;
  if (iVar2._M_current ==
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)stk,iVar2,(int *)&local_54);
  }
  else {
    *iVar2._M_current = root;
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         iVar2._M_current + 1;
  }
  piVar7 = (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  local_38 = this;
  if ((local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start != piVar7) {
    do {
      i = piVar7[-1];
      (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = piVar7 + -1;
      do {
        bVar6 = SparseSetT<void>::contains(reachable,i);
        if (bVar6) break;
        SparseSetT<void>::InsertInternal(reachable,false,i);
        if ((i != local_54) && (bVar6 = SparseArray<int>::has_index(local_48,i), bVar6)) {
          iVar4._M_current =
               (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                      (flat,iVar4);
          }
          else {
            (iVar4._M_current)->out_opcode_ = 0;
            (iVar4._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
            ppIVar1 = &(flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppIVar1 = *ppIVar1 + 1;
          }
          pIVar5 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          pIVar5[-1].out_opcode_ = pIVar5[-1].out_opcode_ & 0xfffffff8 | 6;
          piVar8 = SparseArray<int>::get_existing(local_48,i);
          pIVar5[-1].out_opcode_ = pIVar5[-1].out_opcode_ & 0xf | *piVar8 << 4;
          break;
        }
        pIVar3 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
        switch(pIVar3[(int)i].out_opcode_ & 7) {
        case 1:
          iVar4._M_current =
               (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                      (flat,iVar4);
          }
          else {
            (iVar4._M_current)->out_opcode_ = 0;
            (iVar4._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
            ppIVar1 = &(flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppIVar1 = *ppIVar1 + 1;
          }
          pIVar5 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          uVar9 = (pIVar5[-1].out_opcode_ & 0xfffffff8) + 1;
          pIVar5[-1].out_opcode_ = uVar9;
          iVar10 = (int)((ulong)((long)pIVar5 -
                                (long)(flat->
                                      super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3);
          pIVar5[-1].out_opcode_ = uVar9 & 9 | iVar10 << 4;
          pIVar5[-1].field_1.out1_ = iVar10 + 1;
        case 0:
          if ((pIVar3[(int)i].out_opcode_ & 6) != 0) {
            __assert_fail("opcode() == kInstAlt || opcode() == kInstAltMatch",
                          "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/prog.h"
                          ,0x55,"int re2::Prog::Inst::out1()");
          }
          local_3c = pIVar3[(int)i].field_1;
          iVar2._M_current =
               (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (local_50,iVar2,&local_3c.cap_);
          }
          else {
            *iVar2._M_current = (int)local_3c;
            (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          i = pIVar3[(int)i].out_opcode_ >> 4;
          bVar6 = true;
          break;
        default:
          iVar4._M_current =
               (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                      (flat,iVar4);
          }
          else {
            (iVar4._M_current)->out_opcode_ = 0;
            (iVar4._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
            ppIVar1 = &(flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppIVar1 = *ppIVar1 + 1;
          }
          (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
          super__Vector_impl_data._M_finish[-1] = pIVar3[(int)i];
          pIVar5 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          piVar8 = SparseArray<int>::get_existing(local_48,pIVar3[(int)i].out_opcode_ >> 4);
          pIVar5[-1].out_opcode_ = pIVar5[-1].out_opcode_ & 0xf | *piVar8 << 4;
          bVar6 = false;
          this = local_38;
          break;
        case 5:
        case 7:
          iVar4._M_current =
               (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                      (flat,iVar4);
          }
          else {
            (iVar4._M_current)->out_opcode_ = 0;
            (iVar4._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
            ppIVar1 = &(flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppIVar1 = *ppIVar1 + 1;
          }
          (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
          super__Vector_impl_data._M_finish[-1] = pIVar3[(int)i];
          bVar6 = false;
          break;
        case 6:
          i = pIVar3[(int)i].out_opcode_ >> 4;
          bVar6 = true;
        }
      } while (bVar6);
      piVar7 = (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    } while ((local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start != piVar7);
  }
  return;
}

Assistant:

void Prog::EmitList(int root, SparseArray<int>* rootmap,
                    std::vector<Inst>* flat,
                    SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition. Emit a kInstNop
      // instruction so that the Prog does not become quadratically larger.
      flat->emplace_back();
      flat->back().set_opcode(kInstNop);
      flat->back().set_out(rootmap->get_existing(id));
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
        flat->emplace_back();
        flat->back().set_opcode(kInstAltMatch);
        flat->back().set_out(static_cast<int>(flat->size()));
        flat->back().out1_ = static_cast<uint32_t>(flat->size())+1;
        FALLTHROUGH_INTENDED;

      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        flat->back().set_out(rootmap->get_existing(ip->out()));
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        break;
    }
  }
}